

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O3

int run_test_udp_dual_stack(void)

{
  sa_family_t *psVar1;
  int iVar2;
  anon_union_28_2_e90107a3_for_address *paVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  int iStack_1c;
  uv_interface_address_t *puStack_18;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x18510a;
  iVar2 = can_ipv6();
  if (iVar2 == 0) {
    pcStack_10 = (code *)0x185161;
    run_test_udp_dual_stack_cold_3();
    return 1;
  }
  pcStack_10 = (code *)0x18511e;
  do_test(ipv6_recv_ok,0);
  pcStack_10 = (code *)0x185132;
  printf("recv_cb_called %d\n",(ulong)(uint)recv_cb_called);
  pcStack_10 = (code *)0x185146;
  printf("send_cb_called %d\n",(ulong)(uint)send_cb_called);
  if (recv_cb_called == 1) {
    if (send_cb_called == 1) {
      return 0;
    }
  }
  else {
    pcStack_10 = (code *)0x18516d;
    run_test_udp_dual_stack_cold_1();
  }
  pcStack_10 = can_ipv6;
  run_test_udp_dual_stack_cold_2();
  pcStack_10 = (code *)0x0;
  iVar2 = uv_interface_addresses(&puStack_18,&iStack_1c);
  uVar5 = 0;
  if (iVar2 == 0) {
    if ((long)iStack_1c < 1) {
      uVar5 = 0;
    }
    else {
      paVar3 = &puStack_18->address;
      uVar4 = 1;
      do {
        psVar1 = &(paVar3->address4).sin_family;
        if (*psVar1 == 10) break;
        paVar3 = (anon_union_28_2_e90107a3_for_address *)((long)paVar3 + 0x50);
        bVar6 = uVar4 < (ulong)(long)iStack_1c;
        uVar4 = uVar4 + 1;
      } while (bVar6);
      uVar5 = (uint)(*psVar1 == 10);
    }
    uv_free_interface_addresses(puStack_18,iStack_1c);
  }
  return uVar5;
}

Assistant:

TEST_IMPL(udp_dual_stack) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  /* FIXME: Does Cygwin support this?  */
  RETURN_SKIP("FIXME: This test needs more investigation on Cygwin");
#endif

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

#if defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || defined(__NetBSD__)
  if (!can_ipv6_ipv4_dual())
    RETURN_SKIP("IPv6-IPv4 dual stack not supported");
#elif defined(__OpenBSD__)
  RETURN_SKIP("IPv6-IPv4 dual stack not supported");
#endif

  do_test(ipv6_recv_ok, 0);

  printf("recv_cb_called %d\n", recv_cb_called);
  printf("send_cb_called %d\n", send_cb_called);
  ASSERT(recv_cb_called == 1);
  ASSERT(send_cb_called == 1);

  return 0;
}